

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_base.cpp
# Opt level: O2

void __thiscall ximu::WriterBase::sendWriteDateTimePacket(WriterBase *this,DateTimeData *d)

{
  undefined1 auStack_28 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  
  auStack_28 = (undefined1  [8])0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  PacketConstruction::
  constructWriteDateTimePacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (d,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28);
  (**this->_vptr_WriterBase)(this,auStack_28);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28);
  return;
}

Assistant:

void WriterBase::sendWriteDateTimePacket(DateTimeData& d) {
  std::vector<unsigned char> buffer;
  PacketConstruction::constructWriteDateTimePacket(
      d, back_inserter(buffer));
  sendSerialBuffer(buffer);
}